

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O1

void save_string_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  char *__s;
  size_t sVar1;
  long *plVar2;
  ulong uVar3;
  uint uVar4;
  Am_String string;
  char local_31;
  Am_String local_30;
  
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_STRING");
  Am_String::Am_String(&local_30,value);
  __s = Am_String::operator_cast_to_char_(&local_30);
  sVar1 = strlen(__s);
  uVar4 = (uint)sVar1;
  plVar2 = (long *)std::ostream::operator<<(os,uVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (0 < (int)uVar4) {
    uVar3 = 0;
    do {
      local_31 = __s[uVar3];
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar3);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  Am_String::~Am_String(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_string,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_STRING");
  Am_String string = value;
  const char *string_val = string;
  int length = strlen(string_val);
  os << length << std::endl;
  int i;
  for (i = 0; i < length; ++i) {
    os << string_val[i];
  }
  os << std::endl;
}